

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O2

void __thiscall
LSL_RLEZ<UF>::PerformLabelingMem
          (LSL_RLEZ<UF> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  uint cols;
  int iVar3;
  Mat *m;
  bool bVar4;
  pointer puVar5;
  int r_1;
  uint uVar6;
  uint uVar7;
  pointer piVar8;
  long lVar9;
  pointer piVar10;
  long lVar11;
  void *pvVar12;
  int er;
  long lVar13;
  long lVar14;
  int c;
  void *in_R8;
  ulong uVar15;
  int er_1;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  allocator_type local_599;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_598;
  LSL_RLEZ<UF> *local_590;
  size_t local_588;
  uint local_574;
  ulong local_570;
  void *local_568;
  undefined8 local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 local_538;
  pointer local_530;
  pointer local_528;
  MemVector<int> ner;
  value_type_conflict3 local_4e0;
  MemMat<int> ERA;
  MemMat<int> RLC;
  MemMat<int> ER;
  Mat_<int> local_280;
  MemMat<int> labels;
  MemMat<int> img;
  Mat_<int> local_90;
  
  m = &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat;
  uVar6 = *(uint *)(m + 8);
  cols = *(uint *)(m + 0xc);
  local_598 = accesses;
  local_590 = this;
  cv::Mat_<int>::Mat_(&local_90,m);
  MemMat<int>::MemMat(&img,&local_90);
  cv::Mat::~Mat(&local_90.super_Mat);
  MemMat<int>::MemMat(&ER,uVar6,cols);
  local_574 = cols + 1;
  MemMat<int>::MemMat(&RLC,uVar6,local_574 & 0xfffffffe);
  MemVector<int>::MemVector(&ner,(long)(int)uVar6);
  local_538 = RLC.accesses_._16_8_;
  local_540 = RLC.accesses_._72_8_;
  local_548 = RLC.img_._16_8_;
  local_550 = RLC.img_._72_8_;
  local_528 = ner.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
  local_530 = ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  uVar15 = 0;
  local_568 = (void *)0x0;
  if (0 < (int)cols) {
    local_568 = (void *)(ulong)cols;
  }
  local_570 = 0;
  if (0 < (int)uVar6) {
    local_570 = (ulong)uVar6;
  }
  for (; uVar15 != local_570; uVar15 = uVar15 + 1) {
    iVar17 = 0;
    uVar7 = 0;
    for (in_R8 = (void *)0x0; lVar18 = (long)iVar17, local_568 != in_R8;
        in_R8 = (void *)((long)in_R8 + 1)) {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_ +
                      (long)in_R8 * 4);
      *piVar1 = *piVar1 + 1;
      bVar4 = 0 < *(int *)(*(long *)img.img_._72_8_ * uVar15 + img.img_._16_8_ + (long)in_R8 * 4);
      if (uVar7 != bVar4) {
        piVar1 = (int *)(*(long *)RLC.accesses_._72_8_ * uVar15 + RLC.accesses_._16_8_ + lVar18 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        *(int *)(*(long *)RLC.img_._72_8_ * uVar15 + RLC.img_._16_8_ + lVar18 * 4) = (int)in_R8;
        iVar17 = iVar17 + 1;
      }
      piVar1 = (int *)(*(long *)ER.accesses_._72_8_ * uVar15 + ER.accesses_._16_8_ + (long)in_R8 * 4
                      );
      *piVar1 = *piVar1 + 1;
      *(int *)(*(long *)ER.img_._72_8_ * uVar15 + ER.img_._16_8_ + (long)in_R8 * 4) = iVar17;
      uVar7 = (uint)bVar4;
    }
    if (uVar7 != 0) {
      piVar1 = (int *)(*(long *)RLC.accesses_._72_8_ * uVar15 + RLC.accesses_._16_8_ + lVar18 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)RLC.img_._72_8_ * uVar15 + RLC.img_._16_8_ + lVar18 * 4) = cols;
    }
    ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar15] =
         ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start[uVar15] + 1;
    ner.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar15] = iVar17 + uVar7;
  }
  local_588 = (long)(int)uVar6;
  MemMat<int>::MemMat(&ERA,uVar6,local_574,0);
  uVar2 = *(undefined8 *)&((local_590->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UF::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  UF::MemSetup();
  for (lVar18 = 1;
      *ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = *ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1,
      lVar18 <= *ner.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start; lVar18 = lVar18 + 2) {
    uVar6 = UF::MemNewLabel();
    piVar1 = (int *)(ERA.accesses_._16_8_ + lVar18 * 4);
    *piVar1 = *piVar1 + 1;
    *(uint *)(ERA.img_._16_8_ + lVar18 * 4) = uVar6;
  }
  lVar19 = 0;
  piVar8 = ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar10 = ner.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  for (lVar18 = 1; lVar18 < (long)local_588; lVar18 = lVar18 + 1) {
    lVar14 = lVar18 + -1;
    for (lVar16 = 1; piVar8[lVar18] = piVar8[lVar18] + 1, lVar16 <= piVar10[lVar18];
        lVar16 = lVar16 + 2) {
      lVar9 = *(long *)RLC.accesses_._72_8_ * lVar18 + RLC.accesses_._16_8_;
      piVar1 = (int *)(lVar9 + -4 + lVar16 * 4);
      *piVar1 = *piVar1 + 1;
      lVar11 = *(long *)RLC.img_._72_8_ * lVar18 + RLC.img_._16_8_;
      iVar17 = *(int *)(lVar11 + -4 + lVar16 * 4);
      piVar1 = (int *)(lVar9 + lVar16 * 4);
      *piVar1 = *piVar1 + 1;
      iVar3 = *(int *)(lVar11 + lVar16 * 4);
      lVar13 = *(long *)ER.accesses_._72_8_ * lVar14 + ER.accesses_._16_8_;
      lVar9 = (long)(int)(iVar17 - (uint)(0 < iVar17));
      piVar1 = (int *)(lVar13 + lVar9 * 4);
      *piVar1 = *piVar1 + 1;
      lVar11 = *(long *)ER.img_._72_8_ * lVar14 + ER.img_._16_8_;
      iVar17 = *(int *)(lVar11 + lVar9 * 4);
      lVar9 = (long)(int)(iVar3 - (uint)((int)cols <= iVar3));
      piVar1 = (int *)(lVar13 + lVar9 * 4);
      *piVar1 = *piVar1 + 1;
      uVar6 = *(uint *)(lVar11 + lVar9 * 4);
      uVar15 = (long)iVar17 | 1;
      iVar17 = uVar6 + (uVar6 & 1) + -1;
      if (iVar17 < (int)uVar15) {
        uVar6 = UF::MemNewLabel();
      }
      else {
        piVar1 = (int *)(*(long *)ERA.accesses_._72_8_ * lVar14 + ERA.accesses_._16_8_ + uVar15 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        uVar6 = UF::MemFindRoot(*(uint *)(*(long *)ERA.img_._72_8_ * lVar14 + ERA.img_._16_8_ +
                                         uVar15 * 4));
        while (uVar15 = uVar15 + 2, (long)uVar15 <= (long)iVar17) {
          piVar1 = (int *)(*(long *)ERA.accesses_._72_8_ * lVar19 + ERA.accesses_._16_8_ +
                          uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          uVar7 = UF::MemFindRoot(*(uint *)(*(long *)ERA.img_._72_8_ * lVar19 + ERA.img_._16_8_ +
                                           uVar15 * 4));
          if ((int)uVar6 < (int)uVar7) {
            UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar7] =
                 UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar7] + 1;
            UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar7] = uVar6;
          }
          if ((int)uVar7 < (int)uVar6) {
            UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar6] =
                 UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar6] + 1;
            UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar6] = uVar7;
            uVar6 = uVar7;
          }
        }
      }
      piVar1 = (int *)(*(long *)ERA.accesses_._72_8_ * lVar18 + ERA.accesses_._16_8_ + lVar16 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)ERA.img_._72_8_ * lVar18 + ERA.img_._16_8_ + lVar16 * 4) = uVar6;
      piVar8 = ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = ner.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    lVar19 = lVar19 + 1;
  }
  uVar6 = UF::MemFlatten();
  (local_590->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
  MemMat<int>::MemMat(&labels,(int)local_588,cols);
  for (uVar15 = 0;
      piVar8 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      puVar5 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start, lVar18 = ER.accesses_._16_8_,
      lVar19 = labels.img_._16_8_, lVar14 = ER.img_._16_8_, lVar16 = labels.accesses_._16_8_,
      pvVar12 = local_568, uVar15 != local_570; uVar15 = uVar15 + 1) {
    while (pvVar12 != (void *)0x0) {
      piVar1 = (int *)(lVar18 + *(long *)ER.accesses_._72_8_ * uVar15);
      *piVar1 = *piVar1 + 1;
      lVar9 = (long)*(int *)(lVar14 + *(long *)ER.img_._72_8_ * uVar15);
      piVar1 = (int *)(*(long *)ERA.accesses_._72_8_ * uVar15 + ERA.accesses_._16_8_ + lVar9 * 4);
      *piVar1 = *piVar1 + 1;
      iVar17 = *(int *)(*(long *)ERA.img_._72_8_ * uVar15 + ERA.img_._16_8_ + lVar9 * 4);
      piVar8[iVar17] = piVar8[iVar17] + 1;
      uVar6 = puVar5[iVar17];
      piVar1 = (int *)(lVar16 + *(long *)labels.accesses_._72_8_ * uVar15);
      *piVar1 = *piVar1 + 1;
      in_R8 = (void *)(*(long *)labels.img_._72_8_ * uVar15);
      *(uint *)(lVar19 + (long)in_R8) = uVar6;
      lVar18 = lVar18 + 4;
      lVar19 = lVar19 + 4;
      lVar14 = lVar14 + 4;
      lVar16 = lVar16 + 4;
      pvVar12 = (void *)((long)pvVar12 - 1);
    }
  }
  local_4e0 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_280,4,&local_4e0,
             &local_599);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_598,&local_280);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_280);
  dVar20 = MemMat<int>::GetTotalAccesses(&img);
  *(local_598->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)(dVar20 - 9.223372036854776e+18) & (long)dVar20 >> 0x3f | (long)dVar20;
  dVar20 = MemMat<int>::GetTotalAccesses(&labels);
  (local_598->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(dVar20 - 9.223372036854776e+18) & (long)dVar20 >> 0x3f | (long)dVar20;
  dVar20 = UF::MemTotalAccesses();
  (local_598->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)(dVar20 - 9.223372036854776e+18) & (long)dVar20 >> 0x3f | (long)dVar20;
  local_568 = (void *)MemMat<int>::GetTotalAccesses(&ER);
  dVar20 = MemMat<int>::GetTotalAccesses(&RLC);
  dVar21 = MemVector<int>::GetTotalAccesses(&ner);
  dVar22 = MemMat<int>::GetTotalAccesses(&ERA);
  dVar22 = (double)local_568 + dVar20 + dVar21 + dVar22;
  uVar15 = (ulong)dVar22;
  pvVar12 = (void *)((long)(dVar22 - 9.223372036854776e+18) & (long)uVar15 >> 0x3f | uVar15);
  (local_598->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[3] = (unsigned_long)pvVar12;
  cv::Mat_<int>::clone(&local_280,(__fn *)&labels.img_,pvVar12,(int)((long)uVar15 >> 0x3f),in_R8);
  cv::Mat::operator=(&((local_590->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                      super_Mat,&local_280.super_Mat);
  cv::Mat::~Mat(&local_280.super_Mat);
  MemMat<int>::~MemMat(&labels);
  MemMat<int>::~MemMat(&ERA);
  MemVector<int>::~MemVector(&ner);
  MemMat<int>::~MemMat(&RLC);
  MemMat<int>::~MemMat(&ER);
  MemMat<int>::~MemMat(&img);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        int rows = img_.rows;
        int cols = img_.cols;

        MemMat<int> img(img_);

        // Step 1
        MemMat<int> ER(rows, cols);   // Matrix of relative label (1 label/pixel) 
        MemMat<int> RLC(rows, (cols + 1) & ~1); // MISSING in the paper: RLC requires 2 values/run in row, so width must be next multiple of 2
        MemVector<int> ner(rows); //vector<int> ner(rows); // Number of runs 

        for (int r = 0; r < rows; ++r) {
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c)
            {
                x0 = img(r, c) > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC(r, er) = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER(r, c) = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC(r, er) = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
        }